

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleVector.h
# Opt level: O2

void __thiscall
SimpleVector<MiniScript::InputBufferEntry>::resizeBuffer
          (SimpleVector<MiniScript::InputBufferEntry> *this,long n)

{
  InputBufferEntry *pIVar1;
  InputBufferEntry *pIVar2;
  InputBufferEntry *pIVar3;
  unsigned_long uVar4;
  long lVar5;
  
  if (this->mBufItems != n) {
    pIVar3 = (InputBufferEntry *)operator_new__(-(ulong)((ulong)n >> 0x3d != 0) | n * 8);
    pIVar2 = this->mBuf;
    if (pIVar2 != (InputBufferEntry *)0x0) {
      uVar4 = this->mQtyItems;
      if (n <= (long)this->mQtyItems) {
        uVar4 = n;
      }
      for (lVar5 = 0; pIVar1 = (InputBufferEntry *)((long)&pIVar2->c + lVar5),
          pIVar1 < pIVar2 + uVar4; lVar5 = lVar5 + 8) {
        *(InputBufferEntry *)((long)&pIVar3->c + lVar5) = *pIVar1;
      }
      operator_delete__(pIVar2);
    }
    this->mBuf = pIVar3;
    this->mBufItems = n;
    if ((ulong)n < this->mQtyItems) {
      this->mQtyItems = n;
    }
  }
  return;
}

Assistant:

inline void SimpleVector<T>::resizeBuffer(long n)
{
	if (n == (long)mBufItems) return;
	T *newbuf = new T[n];
//	if (!newbuf) throw memFullErr;	// (not needed, as new now throws if it fails)
	if (mBuf) {
		T* src = mBuf;
		T* dest = newbuf;
		T* end = &mBuf[((long)mQtyItems < n) ? mQtyItems : n];	// the smaller value
		while (src < end) {
			*dest++ = *src++;
		}
		delete[] mBuf;
	}
	mBuf = newbuf;
	mBufItems = n;
	if (mQtyItems > mBufItems) mQtyItems = mBufItems;
 }